

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_netstd_generator.cc
# Opt level: O1

void __thiscall
t_netstd_generator::docstring_comment
          (t_netstd_generator *this,ostream *out,string *comment_start,string *line_prefix,
          string *contents,string *comment_end)

{
  int iVar1;
  ostream *poVar2;
  size_t sVar3;
  stringstream docs;
  char line [1024];
  string local_5e0;
  long local_5c0 [4];
  byte abStack_5a0 [96];
  ios_base local_540 [264];
  string local_438 [32];
  
  iVar1 = std::__cxx11::string::compare((char *)comment_start);
  if (iVar1 != 0) {
    t_generator::indent_abi_cxx11_(local_438,(t_generator *)this);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,(char *)CONCAT71(local_438[0]._M_dataplus._M_p._1_7_,
                                             (char)local_438[0]._M_dataplus._M_p),
                        local_438[0]._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2,(comment_start->_M_dataplus)._M_p,comment_start->_M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_438[0]._M_dataplus._M_p._1_7_,(char)local_438[0]._M_dataplus._M_p) !=
        &local_438[0].field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_438[0]._M_dataplus._M_p._1_7_,
                               (char)local_438[0]._M_dataplus._M_p));
    }
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_5c0,(string *)contents,_S_in);
  if ((abStack_5a0[*(long *)(local_5c0[0] + -0x18)] & 7) == 0) {
    do {
      std::ios::widen((char)*(undefined8 *)(local_5c0[0] + -0x18) + (char)(stringstream *)local_5c0)
      ;
      std::istream::getline((char *)local_5c0,(long)local_438,'\0');
      if ((char)local_438[0]._M_dataplus._M_p == '\0') {
        iVar1 = std::__cxx11::string::compare((char *)line_prefix);
        if ((iVar1 != 0) || ((abStack_5a0[*(long *)(local_5c0[0] + -0x18)] & 2) != 0))
        goto LAB_002d6dbf;
        std::__ostream_insert<char,std::char_traits<char>>
                  (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      }
      else {
LAB_002d6dbf:
        if (((char)local_438[0]._M_dataplus._M_p != '\0') ||
           ((abStack_5a0[*(long *)(local_5c0[0] + -0x18)] & 2) == 0)) {
          t_generator::indent_abi_cxx11_(&local_5e0,(t_generator *)this);
          poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                             (out,local_5e0._M_dataplus._M_p,local_5e0._M_string_length);
          poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar2,(line_prefix->_M_dataplus)._M_p,line_prefix->_M_string_length);
          sVar3 = strlen((char *)local_438);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)local_438,sVar3);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar2,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_5e0._M_dataplus._M_p != &local_5e0.field_2) {
            operator_delete(local_5e0._M_dataplus._M_p);
          }
        }
      }
    } while ((abStack_5a0[*(long *)(local_5c0[0] + -0x18)] & 7) == 0);
  }
  iVar1 = std::__cxx11::string::compare((char *)comment_end);
  if (iVar1 != 0) {
    t_generator::indent_abi_cxx11_(local_438,(t_generator *)this);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,(char *)CONCAT71(local_438[0]._M_dataplus._M_p._1_7_,
                                             (char)local_438[0]._M_dataplus._M_p),
                        local_438[0]._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2,(comment_end->_M_dataplus)._M_p,comment_end->_M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_438[0]._M_dataplus._M_p._1_7_,(char)local_438[0]._M_dataplus._M_p) !=
        &local_438[0].field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_438[0]._M_dataplus._M_p._1_7_,
                               (char)local_438[0]._M_dataplus._M_p));
    }
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_5c0);
  std::ios_base::~ios_base(local_540);
  return;
}

Assistant:

void t_netstd_generator::docstring_comment(ostream& out, const string& comment_start, const string& line_prefix, const string& contents, const string& comment_end)
{
    if (comment_start != "")
    {
        out << indent() << comment_start;
    }

    stringstream docs(contents, std::ios_base::in);

    while (!(docs.eof() || docs.fail()))
    {
        char line[1024];
        docs.getline(line, 1024);

        // Just prnt a newline when the line & prefix are empty.
        if (strlen(line) == 0 && line_prefix == "" && !docs.eof())
        {
            out << endl;
        }
        else if (strlen(line) > 0 || !docs.eof())
        { // skip the empty last line
            out << indent() << line_prefix << line << endl;
        }
    }
    if (comment_end != "")
    {
        out << indent() << comment_end;
    }
}